

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

istream * L12_1::operator>>(istream *is,String *str)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char local_68 [8];
  char temp [80];
  String *str_local;
  istream *is_local;
  
  temp._72_8_ = str;
  std::istream::get((char *)is,(long)local_68);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(is + *(long *)(*(long *)is + -0x18)));
  if (bVar1) {
    String::operator=((String *)temp._72_8_,local_68);
  }
  do {
    bVar2 = std::ios::operator_cast_to_bool((ios *)(is + *(long *)(*(long *)is + -0x18)));
    bVar1 = false;
    if (bVar2) {
      iVar3 = std::istream::get();
      bVar1 = iVar3 != 10;
    }
  } while (bVar1);
  return is;
}

Assistant:

std::istream& operator>>(std::istream &is, String &str) {
        char temp[String::CIN_LIMIT];
        //  取一定长度的字符，存到 temp 里
        is.get(temp, String::CIN_LIMIT);
        if (is) {
            //  赋值给 string 对象
            str = temp;
        }
        //  有内容且下一个内容不是换行符 => 一直读到没内容/下一个内容是换行符时，return
        while(is && is.get() != '\n') {
            continue;
        }
        return is;
    }